

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

MDNode * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::MDNode,LLVMBC::Module*&,std::vector<LLVMBC::MDOperand*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand*>>>
          (LLVMContext *this,Module **u,
          vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *u_1)

{
  Module *module;
  vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> local_48;
  MDNode *local_30;
  MDNode *t;
  MDNode *mem;
  vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *u_local_1;
  Module **u_local;
  LLVMContext *this_local;
  
  mem = (MDNode *)u_1;
  u_local_1 = (vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *)u
  ;
  u_local = (Module **)this;
  local_30 = (MDNode *)allocate(this,0x30,8);
  t = local_30;
  if (local_30 == (MDNode *)0x0) {
    std::terminate();
  }
  module = (Module *)
           (u_local_1->
           super__Vector_base<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::vector
            (&local_48,
             (vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_> *)
             mem);
  MDNode::MDNode(local_30,module,&local_48);
  std::vector<LLVMBC::MDOperand_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDOperand_*>_>::~vector
            (&local_48);
  append_typed_destructor<LLVMBC::MDNode>(this,local_30);
  return local_30;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}